

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasthessian_opt.cpp
# Opt level: O0

void compute_response_layers_at_once(fasthessian *fh)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  int *piVar5;
  int *piVar6;
  int *piVar7;
  int *piVar8;
  int *piVar9;
  int *piVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  long in_RDI;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  int j;
  int ind4;
  int ind2;
  int ind;
  int i;
  float inv_area_squared7;
  float inv_area_squared6;
  float inv_area_squared5;
  float inv_area_squared4;
  float inv_area_squared3;
  float inv_area_squared2;
  float inv_area_squared1;
  float inv_area_squared0;
  float inv_area7;
  float inv_area6;
  float inv_area5;
  float inv_area4;
  float inv_area3;
  float inv_area2;
  float inv_area1;
  float inv_area0;
  int border7;
  int border6;
  int border5;
  int border4;
  int border3;
  int border2;
  int border1;
  int border0;
  int lobe7;
  int lobe6;
  int lobe5;
  int lobe4;
  int lobe3;
  int lobe2;
  int lobe1;
  int lobe0;
  int width;
  int height;
  int filter_size7;
  int filter_size6;
  int filter_size5;
  int filter_size4;
  int filter_size3;
  int filter_size2;
  int filter_size1;
  int filter_size0;
  bool *laplacian7;
  bool *laplacian6;
  bool *laplacian5;
  bool *laplacian4;
  bool *laplacian3;
  bool *laplacian2;
  bool *laplacian1;
  bool *laplacian0;
  float *response7;
  float *response6;
  float *response5;
  float *response4;
  float *response3;
  float *response2;
  float *response1;
  float *response0;
  response_layer *layer7;
  response_layer *layer6;
  response_layer *layer5;
  response_layer *layer4;
  response_layer *layer3;
  response_layer *layer2;
  response_layer *layer1;
  response_layer *layer0;
  integral_image *iimage;
  int step;
  int y;
  int x;
  float Dxy7;
  float Dyy7;
  float Dxx7;
  float Dxy6;
  float Dyy6;
  float Dxx6;
  float Dxy5;
  float Dyy5;
  float Dxx5;
  float Dxy4;
  float Dyy4;
  float Dxx4;
  float Dxy3;
  float Dyy3;
  float Dxx3;
  float Dxy2;
  float Dyy2;
  float Dxx2;
  float Dxy1;
  float Dyy1;
  float Dxx1;
  float Dxy0;
  float Dyy0;
  float Dxx0;
  float in_stack_fffffffffffffdb0;
  float in_stack_fffffffffffffdb4;
  float in_stack_fffffffffffffdb8;
  float in_stack_fffffffffffffdbc;
  float in_stack_fffffffffffffdc0;
  float in_stack_fffffffffffffdc4;
  int local_1fc;
  int local_1f8;
  int local_1f4;
  int local_1f0;
  int local_1ec;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_03 [60];
  undefined1 extraout_var_04 [60];
  undefined1 extraout_var_05 [60];
  undefined1 extraout_var_06 [60];
  undefined1 extraout_var_07 [60];
  undefined1 extraout_var_08 [60];
  undefined1 extraout_var_09 [60];
  undefined1 extraout_var_10 [60];
  undefined1 extraout_var_11 [60];
  undefined1 extraout_var_12 [60];
  undefined1 extraout_var_13 [60];
  undefined1 extraout_var_14 [60];
  
  piVar3 = *(int **)(in_RDI + 8);
  piVar4 = *(int **)(in_RDI + 0x10);
  piVar5 = *(int **)(in_RDI + 0x18);
  piVar6 = *(int **)(in_RDI + 0x20);
  piVar7 = *(int **)(in_RDI + 0x28);
  piVar8 = *(int **)(in_RDI + 0x30);
  piVar9 = *(int **)(in_RDI + 0x38);
  piVar10 = *(int **)(in_RDI + 0x40);
  lVar11 = *(long *)(piVar3 + 4);
  lVar12 = *(long *)(piVar4 + 4);
  lVar13 = *(long *)(piVar5 + 4);
  lVar14 = *(long *)(piVar6 + 4);
  lVar15 = *(long *)(piVar7 + 4);
  lVar16 = *(long *)(piVar8 + 4);
  lVar17 = *(long *)(piVar9 + 4);
  lVar18 = *(long *)(piVar10 + 4);
  lVar19 = *(long *)(piVar3 + 6);
  lVar20 = *(long *)(piVar4 + 6);
  lVar21 = *(long *)(piVar5 + 6);
  lVar22 = *(long *)(piVar6 + 6);
  lVar23 = *(long *)(piVar7 + 6);
  lVar24 = *(long *)(piVar8 + 6);
  lVar25 = *(long *)(piVar9 + 6);
  lVar26 = *(long *)(piVar10 + 6);
  iVar1 = piVar3[2];
  iVar2 = piVar3[1];
  fVar30 = 1.0 / (float)(*piVar3 * *piVar3);
  fVar31 = 1.0 / (float)(*piVar4 * *piVar4);
  fVar32 = 1.0 / (float)(*piVar5 * *piVar5);
  fVar33 = 1.0 / (float)(*piVar6 * *piVar6);
  fVar34 = 1.0 / (float)(*piVar7 * *piVar7);
  fVar35 = 1.0 / (float)(*piVar8 * *piVar8);
  fVar36 = 1.0 / (float)(*piVar9 * *piVar9);
  fVar37 = 1.0 / (float)(*piVar10 * *piVar10);
  local_1f0 = 0;
  local_1f4 = 0;
  local_1f8 = 0;
  for (local_1ec = 0; local_1ec < iVar1; local_1ec = local_1ec + 1) {
    for (local_1fc = 0; local_1fc < iVar2; local_1fc = local_1fc + 1) {
      fVar38 = box_integral((integral_image *)
                            CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                            (int)in_stack_fffffffffffffdbc,(int)in_stack_fffffffffffffdb8,
                            (int)in_stack_fffffffffffffdb4,(int)in_stack_fffffffffffffdb0);
      auVar42._0_4_ =
           box_integral((integral_image *)
                        CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                        (int)in_stack_fffffffffffffdbc,(int)in_stack_fffffffffffffdb8,
                        (int)in_stack_fffffffffffffdb4,(int)in_stack_fffffffffffffdb0);
      auVar42._4_60_ = extraout_var;
      auVar27 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),auVar42._0_16_,ZEXT416((uint)fVar38))
      ;
      fVar38 = box_integral((integral_image *)
                            CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                            (int)in_stack_fffffffffffffdbc,(int)in_stack_fffffffffffffdb8,
                            (int)in_stack_fffffffffffffdb4,(int)in_stack_fffffffffffffdb0);
      auVar43._0_4_ =
           box_integral((integral_image *)
                        CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                        (int)in_stack_fffffffffffffdbc,(int)in_stack_fffffffffffffdb8,
                        (int)in_stack_fffffffffffffdb4,(int)in_stack_fffffffffffffdb0);
      auVar43._4_60_ = extraout_var_00;
      auVar28 = vfmadd213ss_fma(ZEXT416(0xc0400000),auVar43._0_16_,ZEXT416((uint)fVar38));
      in_stack_fffffffffffffdb0 =
           box_integral((integral_image *)
                        CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                        (int)in_stack_fffffffffffffdbc,(int)in_stack_fffffffffffffdb8,
                        (int)in_stack_fffffffffffffdb4,(int)in_stack_fffffffffffffdb0);
      fVar38 = box_integral((integral_image *)
                            CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                            (int)in_stack_fffffffffffffdbc,(int)in_stack_fffffffffffffdb8,
                            (int)in_stack_fffffffffffffdb4,(int)in_stack_fffffffffffffdb0);
      in_stack_fffffffffffffdb4 = in_stack_fffffffffffffdb0 + fVar38;
      fVar38 = box_integral((integral_image *)
                            CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                            (int)in_stack_fffffffffffffdbc,(int)in_stack_fffffffffffffdb8,
                            (int)in_stack_fffffffffffffdb4,(int)in_stack_fffffffffffffdb0);
      in_stack_fffffffffffffdb8 = in_stack_fffffffffffffdb4 - fVar38;
      fVar38 = box_integral((integral_image *)
                            CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                            (int)in_stack_fffffffffffffdbc,(int)in_stack_fffffffffffffdb8,
                            (int)in_stack_fffffffffffffdb4,(int)in_stack_fffffffffffffdb0);
      auVar29 = vfmsub213ss_fma(ZEXT416((uint)auVar28._0_4_),ZEXT416((uint)auVar27._0_4_),
                                ZEXT416((uint)((in_stack_fffffffffffffdb8 - fVar38) * 0.81 *
                                              (in_stack_fffffffffffffdb8 - fVar38))));
      *(float *)(lVar11 + (long)local_1f0 * 4) = fVar30 * fVar30 * auVar29._0_4_;
      *(bool *)(lVar19 + local_1f0) = 0.0 <= auVar27._0_4_ + auVar28._0_4_;
      in_stack_fffffffffffffdbc =
           box_integral((integral_image *)
                        CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                        (int)in_stack_fffffffffffffdbc,(int)in_stack_fffffffffffffdb8,
                        (int)in_stack_fffffffffffffdb4,(int)in_stack_fffffffffffffdb0);
      auVar44._0_4_ =
           box_integral((integral_image *)
                        CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                        (int)in_stack_fffffffffffffdbc,(int)in_stack_fffffffffffffdb8,
                        (int)in_stack_fffffffffffffdb4,(int)in_stack_fffffffffffffdb0);
      auVar44._4_60_ = extraout_var_01;
      auVar27 = vfmadd213ss_fma(ZEXT416(0xc0400000),auVar44._0_16_,
                                ZEXT416((uint)in_stack_fffffffffffffdbc));
      in_stack_fffffffffffffdc0 =
           box_integral((integral_image *)
                        CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                        (int)in_stack_fffffffffffffdbc,(int)in_stack_fffffffffffffdb8,
                        (int)in_stack_fffffffffffffdb4,(int)in_stack_fffffffffffffdb0);
      auVar45._0_4_ =
           box_integral((integral_image *)
                        CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                        (int)in_stack_fffffffffffffdbc,(int)in_stack_fffffffffffffdb8,
                        (int)in_stack_fffffffffffffdb4,(int)in_stack_fffffffffffffdb0);
      auVar45._4_60_ = extraout_var_02;
      auVar28 = vfmadd213ss_fma(ZEXT416(0xc0400000),auVar45._0_16_,
                                ZEXT416((uint)in_stack_fffffffffffffdc0));
      in_stack_fffffffffffffdc4 =
           box_integral((integral_image *)
                        CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                        (int)in_stack_fffffffffffffdbc,(int)in_stack_fffffffffffffdb8,
                        (int)in_stack_fffffffffffffdb4,(int)in_stack_fffffffffffffdb0);
      fVar38 = box_integral((integral_image *)
                            CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                            (int)in_stack_fffffffffffffdbc,(int)in_stack_fffffffffffffdb8,
                            (int)in_stack_fffffffffffffdb4,(int)in_stack_fffffffffffffdb0);
      fVar38 = in_stack_fffffffffffffdc4 + fVar38;
      fVar39 = box_integral((integral_image *)
                            CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                            (int)in_stack_fffffffffffffdbc,(int)in_stack_fffffffffffffdb8,
                            (int)in_stack_fffffffffffffdb4,(int)in_stack_fffffffffffffdb0);
      fVar40 = box_integral((integral_image *)
                            CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                            (int)in_stack_fffffffffffffdbc,(int)in_stack_fffffffffffffdb8,
                            (int)in_stack_fffffffffffffdb4,(int)in_stack_fffffffffffffdb0);
      fVar40 = (fVar38 - fVar39) - fVar40;
      auVar29 = vfmsub213ss_fma(ZEXT416((uint)auVar28._0_4_),ZEXT416((uint)auVar27._0_4_),
                                ZEXT416((uint)(fVar40 * 0.81 * fVar40)));
      *(float *)(lVar12 + (long)local_1f0 * 4) = fVar31 * fVar31 * auVar29._0_4_;
      *(bool *)(lVar20 + local_1f0) = 0.0 <= auVar27._0_4_ + auVar28._0_4_;
      fVar38 = box_integral((integral_image *)
                            CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                            (int)in_stack_fffffffffffffdbc,(int)in_stack_fffffffffffffdb8,
                            (int)in_stack_fffffffffffffdb4,(int)in_stack_fffffffffffffdb0);
      auVar46._0_4_ =
           box_integral((integral_image *)
                        CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                        (int)in_stack_fffffffffffffdbc,(int)in_stack_fffffffffffffdb8,
                        (int)in_stack_fffffffffffffdb4,(int)in_stack_fffffffffffffdb0);
      auVar46._4_60_ = extraout_var_03;
      auVar27 = vfmadd213ss_fma(ZEXT416(0xc0400000),auVar46._0_16_,ZEXT416((uint)fVar38));
      fVar38 = box_integral((integral_image *)
                            CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                            (int)in_stack_fffffffffffffdbc,(int)in_stack_fffffffffffffdb8,
                            (int)in_stack_fffffffffffffdb4,(int)in_stack_fffffffffffffdb0);
      auVar47._0_4_ =
           box_integral((integral_image *)
                        CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                        (int)in_stack_fffffffffffffdbc,(int)in_stack_fffffffffffffdb8,
                        (int)in_stack_fffffffffffffdb4,(int)in_stack_fffffffffffffdb0);
      auVar47._4_60_ = extraout_var_04;
      auVar28 = vfmadd213ss_fma(ZEXT416(0xc0400000),auVar47._0_16_,ZEXT416((uint)fVar38));
      fVar40 = box_integral((integral_image *)
                            CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                            (int)in_stack_fffffffffffffdbc,(int)in_stack_fffffffffffffdb8,
                            (int)in_stack_fffffffffffffdb4,(int)in_stack_fffffffffffffdb0);
      fVar39 = box_integral((integral_image *)
                            CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                            (int)in_stack_fffffffffffffdbc,(int)in_stack_fffffffffffffdb8,
                            (int)in_stack_fffffffffffffdb4,(int)in_stack_fffffffffffffdb0);
      fVar41 = box_integral((integral_image *)
                            CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                            (int)in_stack_fffffffffffffdbc,(int)in_stack_fffffffffffffdb8,
                            (int)in_stack_fffffffffffffdb4,(int)in_stack_fffffffffffffdb0);
      fVar38 = box_integral((integral_image *)
                            CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                            (int)in_stack_fffffffffffffdbc,(int)in_stack_fffffffffffffdb8,
                            (int)in_stack_fffffffffffffdb4,(int)in_stack_fffffffffffffdb0);
      fVar38 = ((fVar40 + fVar39) - fVar41) - fVar38;
      auVar29 = vfmsub213ss_fma(ZEXT416((uint)auVar28._0_4_),ZEXT416((uint)auVar27._0_4_),
                                ZEXT416((uint)(fVar38 * 0.81 * fVar38)));
      *(float *)(lVar13 + (long)local_1f0 * 4) = fVar32 * fVar32 * auVar29._0_4_;
      *(bool *)(lVar21 + local_1f0) = 0.0 <= auVar27._0_4_ + auVar28._0_4_;
      fVar38 = box_integral((integral_image *)
                            CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                            (int)in_stack_fffffffffffffdbc,(int)in_stack_fffffffffffffdb8,
                            (int)in_stack_fffffffffffffdb4,(int)in_stack_fffffffffffffdb0);
      auVar48._0_4_ =
           box_integral((integral_image *)
                        CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                        (int)in_stack_fffffffffffffdbc,(int)in_stack_fffffffffffffdb8,
                        (int)in_stack_fffffffffffffdb4,(int)in_stack_fffffffffffffdb0);
      auVar48._4_60_ = extraout_var_05;
      auVar27 = vfmadd213ss_fma(ZEXT416(0xc0400000),auVar48._0_16_,ZEXT416((uint)fVar38));
      fVar38 = box_integral((integral_image *)
                            CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                            (int)in_stack_fffffffffffffdbc,(int)in_stack_fffffffffffffdb8,
                            (int)in_stack_fffffffffffffdb4,(int)in_stack_fffffffffffffdb0);
      auVar49._0_4_ =
           box_integral((integral_image *)
                        CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                        (int)in_stack_fffffffffffffdbc,(int)in_stack_fffffffffffffdb8,
                        (int)in_stack_fffffffffffffdb4,(int)in_stack_fffffffffffffdb0);
      auVar49._4_60_ = extraout_var_06;
      auVar28 = vfmadd213ss_fma(ZEXT416(0xc0400000),auVar49._0_16_,ZEXT416((uint)fVar38));
      fVar40 = box_integral((integral_image *)
                            CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                            (int)in_stack_fffffffffffffdbc,(int)in_stack_fffffffffffffdb8,
                            (int)in_stack_fffffffffffffdb4,(int)in_stack_fffffffffffffdb0);
      fVar39 = box_integral((integral_image *)
                            CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                            (int)in_stack_fffffffffffffdbc,(int)in_stack_fffffffffffffdb8,
                            (int)in_stack_fffffffffffffdb4,(int)in_stack_fffffffffffffdb0);
      fVar41 = box_integral((integral_image *)
                            CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                            (int)in_stack_fffffffffffffdbc,(int)in_stack_fffffffffffffdb8,
                            (int)in_stack_fffffffffffffdb4,(int)in_stack_fffffffffffffdb0);
      fVar38 = box_integral((integral_image *)
                            CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                            (int)in_stack_fffffffffffffdbc,(int)in_stack_fffffffffffffdb8,
                            (int)in_stack_fffffffffffffdb4,(int)in_stack_fffffffffffffdb0);
      fVar38 = ((fVar40 + fVar39) - fVar41) - fVar38;
      auVar29 = vfmsub213ss_fma(ZEXT416((uint)auVar28._0_4_),ZEXT416((uint)auVar27._0_4_),
                                ZEXT416((uint)(fVar38 * 0.81 * fVar38)));
      *(float *)(lVar14 + (long)local_1f0 * 4) = fVar33 * fVar33 * auVar29._0_4_;
      *(byte *)(lVar22 + local_1f0) = (auVar27._0_4_ + auVar28._0_4_ < 0.0) - 1U & 1;
      if ((local_1ec % 2 == 0) && (local_1fc % 2 == 0)) {
        fVar38 = box_integral((integral_image *)
                              CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                              (int)in_stack_fffffffffffffdbc,(int)in_stack_fffffffffffffdb8,
                              (int)in_stack_fffffffffffffdb4,(int)in_stack_fffffffffffffdb0);
        auVar50._0_4_ =
             box_integral((integral_image *)
                          CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                          (int)in_stack_fffffffffffffdbc,(int)in_stack_fffffffffffffdb8,
                          (int)in_stack_fffffffffffffdb4,(int)in_stack_fffffffffffffdb0);
        auVar50._4_60_ = extraout_var_07;
        auVar27 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),auVar50._0_16_,
                                  ZEXT416((uint)fVar38));
        fVar38 = box_integral((integral_image *)
                              CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                              (int)in_stack_fffffffffffffdbc,(int)in_stack_fffffffffffffdb8,
                              (int)in_stack_fffffffffffffdb4,(int)in_stack_fffffffffffffdb0);
        auVar51._0_4_ =
             box_integral((integral_image *)
                          CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                          (int)in_stack_fffffffffffffdbc,(int)in_stack_fffffffffffffdb8,
                          (int)in_stack_fffffffffffffdb4,(int)in_stack_fffffffffffffdb0);
        auVar51._4_60_ = extraout_var_08;
        auVar28 = vfmadd213ss_fma(ZEXT416(0xc0400000),auVar51._0_16_,ZEXT416((uint)fVar38));
        fVar40 = box_integral((integral_image *)
                              CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                              (int)in_stack_fffffffffffffdbc,(int)in_stack_fffffffffffffdb8,
                              (int)in_stack_fffffffffffffdb4,(int)in_stack_fffffffffffffdb0);
        fVar39 = box_integral((integral_image *)
                              CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                              (int)in_stack_fffffffffffffdbc,(int)in_stack_fffffffffffffdb8,
                              (int)in_stack_fffffffffffffdb4,(int)in_stack_fffffffffffffdb0);
        fVar41 = box_integral((integral_image *)
                              CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                              (int)in_stack_fffffffffffffdbc,(int)in_stack_fffffffffffffdb8,
                              (int)in_stack_fffffffffffffdb4,(int)in_stack_fffffffffffffdb0);
        fVar38 = box_integral((integral_image *)
                              CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                              (int)in_stack_fffffffffffffdbc,(int)in_stack_fffffffffffffdb8,
                              (int)in_stack_fffffffffffffdb4,(int)in_stack_fffffffffffffdb0);
        fVar38 = ((fVar40 + fVar39) - fVar41) - fVar38;
        auVar29 = vfmsub213ss_fma(ZEXT416((uint)auVar28._0_4_),ZEXT416((uint)auVar27._0_4_),
                                  ZEXT416((uint)(fVar38 * 0.81 * fVar38)));
        *(float *)(lVar15 + (long)local_1f4 * 4) = fVar34 * fVar34 * auVar29._0_4_;
        *(bool *)(lVar23 + local_1f4) = 0.0 <= auVar27._0_4_ + auVar28._0_4_;
        fVar38 = box_integral((integral_image *)
                              CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                              (int)in_stack_fffffffffffffdbc,(int)in_stack_fffffffffffffdb8,
                              (int)in_stack_fffffffffffffdb4,(int)in_stack_fffffffffffffdb0);
        auVar52._0_4_ =
             box_integral((integral_image *)
                          CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                          (int)in_stack_fffffffffffffdbc,(int)in_stack_fffffffffffffdb8,
                          (int)in_stack_fffffffffffffdb4,(int)in_stack_fffffffffffffdb0);
        auVar52._4_60_ = extraout_var_09;
        auVar27 = vfmadd213ss_fma(ZEXT416(0xc0400000),auVar52._0_16_,ZEXT416((uint)fVar38));
        fVar38 = box_integral((integral_image *)
                              CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                              (int)in_stack_fffffffffffffdbc,(int)in_stack_fffffffffffffdb8,
                              (int)in_stack_fffffffffffffdb4,(int)in_stack_fffffffffffffdb0);
        auVar53._0_4_ =
             box_integral((integral_image *)
                          CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                          (int)in_stack_fffffffffffffdbc,(int)in_stack_fffffffffffffdb8,
                          (int)in_stack_fffffffffffffdb4,(int)in_stack_fffffffffffffdb0);
        auVar53._4_60_ = extraout_var_10;
        auVar28 = vfmadd213ss_fma(ZEXT416(0xc0400000),auVar53._0_16_,ZEXT416((uint)fVar38));
        fVar40 = box_integral((integral_image *)
                              CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                              (int)in_stack_fffffffffffffdbc,(int)in_stack_fffffffffffffdb8,
                              (int)in_stack_fffffffffffffdb4,(int)in_stack_fffffffffffffdb0);
        fVar39 = box_integral((integral_image *)
                              CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                              (int)in_stack_fffffffffffffdbc,(int)in_stack_fffffffffffffdb8,
                              (int)in_stack_fffffffffffffdb4,(int)in_stack_fffffffffffffdb0);
        fVar41 = box_integral((integral_image *)
                              CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                              (int)in_stack_fffffffffffffdbc,(int)in_stack_fffffffffffffdb8,
                              (int)in_stack_fffffffffffffdb4,(int)in_stack_fffffffffffffdb0);
        fVar38 = box_integral((integral_image *)
                              CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                              (int)in_stack_fffffffffffffdbc,(int)in_stack_fffffffffffffdb8,
                              (int)in_stack_fffffffffffffdb4,(int)in_stack_fffffffffffffdb0);
        fVar38 = ((fVar40 + fVar39) - fVar41) - fVar38;
        auVar29 = vfmsub213ss_fma(ZEXT416((uint)auVar28._0_4_),ZEXT416((uint)auVar27._0_4_),
                                  ZEXT416((uint)(fVar38 * 0.81 * fVar38)));
        *(float *)(lVar16 + (long)local_1f4 * 4) = fVar35 * fVar35 * auVar29._0_4_;
        *(byte *)(lVar24 + local_1f4) = (auVar27._0_4_ + auVar28._0_4_ < 0.0) - 1U & 1;
        local_1f4 = local_1f4 + 1;
        if ((local_1ec % 4 == 0) && (local_1fc % 4 == 0)) {
          fVar38 = box_integral((integral_image *)
                                CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                                (int)in_stack_fffffffffffffdbc,(int)in_stack_fffffffffffffdb8,
                                (int)in_stack_fffffffffffffdb4,(int)in_stack_fffffffffffffdb0);
          auVar54._0_4_ =
               box_integral((integral_image *)
                            CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                            (int)in_stack_fffffffffffffdbc,(int)in_stack_fffffffffffffdb8,
                            (int)in_stack_fffffffffffffdb4,(int)in_stack_fffffffffffffdb0);
          auVar54._4_60_ = extraout_var_11;
          auVar27 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),auVar54._0_16_,
                                    ZEXT416((uint)fVar38));
          fVar38 = box_integral((integral_image *)
                                CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                                (int)in_stack_fffffffffffffdbc,(int)in_stack_fffffffffffffdb8,
                                (int)in_stack_fffffffffffffdb4,(int)in_stack_fffffffffffffdb0);
          auVar55._0_4_ =
               box_integral((integral_image *)
                            CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                            (int)in_stack_fffffffffffffdbc,(int)in_stack_fffffffffffffdb8,
                            (int)in_stack_fffffffffffffdb4,(int)in_stack_fffffffffffffdb0);
          auVar55._4_60_ = extraout_var_12;
          auVar28 = vfmadd213ss_fma(ZEXT416(0xc0400000),auVar55._0_16_,ZEXT416((uint)fVar38));
          fVar40 = box_integral((integral_image *)
                                CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                                (int)in_stack_fffffffffffffdbc,(int)in_stack_fffffffffffffdb8,
                                (int)in_stack_fffffffffffffdb4,(int)in_stack_fffffffffffffdb0);
          fVar39 = box_integral((integral_image *)
                                CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                                (int)in_stack_fffffffffffffdbc,(int)in_stack_fffffffffffffdb8,
                                (int)in_stack_fffffffffffffdb4,(int)in_stack_fffffffffffffdb0);
          fVar41 = box_integral((integral_image *)
                                CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                                (int)in_stack_fffffffffffffdbc,(int)in_stack_fffffffffffffdb8,
                                (int)in_stack_fffffffffffffdb4,(int)in_stack_fffffffffffffdb0);
          fVar38 = box_integral((integral_image *)
                                CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                                (int)in_stack_fffffffffffffdbc,(int)in_stack_fffffffffffffdb8,
                                (int)in_stack_fffffffffffffdb4,(int)in_stack_fffffffffffffdb0);
          fVar38 = ((fVar40 + fVar39) - fVar41) - fVar38;
          auVar29 = vfmsub213ss_fma(ZEXT416((uint)auVar28._0_4_),ZEXT416((uint)auVar27._0_4_),
                                    ZEXT416((uint)(fVar38 * 0.81 * fVar38)));
          *(float *)(lVar17 + (long)local_1f8 * 4) = fVar36 * fVar36 * auVar29._0_4_;
          *(bool *)(lVar25 + local_1f8) = 0.0 <= auVar27._0_4_ + auVar28._0_4_;
          fVar38 = box_integral((integral_image *)
                                CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                                (int)in_stack_fffffffffffffdbc,(int)in_stack_fffffffffffffdb8,
                                (int)in_stack_fffffffffffffdb4,(int)in_stack_fffffffffffffdb0);
          auVar56._0_4_ =
               box_integral((integral_image *)
                            CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                            (int)in_stack_fffffffffffffdbc,(int)in_stack_fffffffffffffdb8,
                            (int)in_stack_fffffffffffffdb4,(int)in_stack_fffffffffffffdb0);
          auVar56._4_60_ = extraout_var_13;
          auVar27 = vfmadd213ss_fma(ZEXT416(0xc0400000),auVar56._0_16_,ZEXT416((uint)fVar38));
          fVar38 = box_integral((integral_image *)
                                CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                                (int)in_stack_fffffffffffffdbc,(int)in_stack_fffffffffffffdb8,
                                (int)in_stack_fffffffffffffdb4,(int)in_stack_fffffffffffffdb0);
          auVar57._0_4_ =
               box_integral((integral_image *)
                            CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                            (int)in_stack_fffffffffffffdbc,(int)in_stack_fffffffffffffdb8,
                            (int)in_stack_fffffffffffffdb4,(int)in_stack_fffffffffffffdb0);
          auVar57._4_60_ = extraout_var_14;
          auVar28 = vfmadd213ss_fma(ZEXT416(0xc0400000),auVar57._0_16_,ZEXT416((uint)fVar38));
          fVar40 = box_integral((integral_image *)
                                CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                                (int)in_stack_fffffffffffffdbc,(int)in_stack_fffffffffffffdb8,
                                (int)in_stack_fffffffffffffdb4,(int)in_stack_fffffffffffffdb0);
          fVar39 = box_integral((integral_image *)
                                CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                                (int)in_stack_fffffffffffffdbc,(int)in_stack_fffffffffffffdb8,
                                (int)in_stack_fffffffffffffdb4,(int)in_stack_fffffffffffffdb0);
          fVar41 = box_integral((integral_image *)
                                CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                                (int)in_stack_fffffffffffffdbc,(int)in_stack_fffffffffffffdb8,
                                (int)in_stack_fffffffffffffdb4,(int)in_stack_fffffffffffffdb0);
          fVar38 = box_integral((integral_image *)
                                CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                                (int)in_stack_fffffffffffffdbc,(int)in_stack_fffffffffffffdb8,
                                (int)in_stack_fffffffffffffdb4,(int)in_stack_fffffffffffffdb0);
          fVar38 = ((fVar40 + fVar39) - fVar41) - fVar38;
          auVar29 = vfmsub213ss_fma(ZEXT416((uint)auVar28._0_4_),ZEXT416((uint)auVar27._0_4_),
                                    ZEXT416((uint)(fVar38 * 0.81 * fVar38)));
          *(float *)(lVar18 + (long)local_1f8 * 4) = fVar37 * fVar37 * auVar29._0_4_;
          *(byte *)(lVar26 + local_1f8) = (auVar27._0_4_ + auVar28._0_4_ < 0.0) - 1U & 1;
          local_1f8 = local_1f8 + 1;
        }
      }
      local_1f0 = local_1f0 + 1;
    }
  }
  return;
}

Assistant:

void compute_response_layers_at_once(struct fasthessian* fh) {
    /*
    TODO: (valentin) add index precomputation as in compute_response_layer_precompute

    optimizations:
        - precompute inv_area_squared as in compute_response_layer_precompute
        - computes all 8 response layers at once, gives same results as base implementation


    Results:
        - slower than before :(
        - valgrind reports no improvement for l1 misses, i.e. locality is not improved as expected
            guess due to different filter sizes always accesing different cachelines
            need to be smarter about computation order to gain benefit (i.e. same mem addresses are actually accessed at once)
    */
    float Dxx0, Dyy0, Dxy0;
    float Dxx1, Dyy1, Dxy1;
    float Dxx2, Dyy2, Dxy2;
    float Dxx3, Dyy3, Dxy3;
    float Dxx4, Dyy4, Dxy4;
    float Dxx5, Dyy5, Dxy5;
    float Dxx6, Dyy6, Dxy6;
    float Dxx7, Dyy7, Dxy7;

    int x, y;
    int step = fh->step;
    struct integral_image* iimage = fh->iimage;

    // step == 1: 0,1,2,3
    // step == 2: 4,5
    // step == 4: 6,7

    struct response_layer *layer0 = fh->response_map[0];  // step0 == step
    struct response_layer *layer1 = fh->response_map[1];  // step1 == step
    struct response_layer *layer2 = fh->response_map[2];  // step2 == step
    struct response_layer *layer3 = fh->response_map[3];  // step3 == step

    struct response_layer *layer4 = fh->response_map[4];  // step4 == 2*step
    struct response_layer *layer5 = fh->response_map[5];  // step5 == 2*step

    struct response_layer *layer6 = fh->response_map[6];  // step6 == 4*step
    struct response_layer *layer7 = fh->response_map[7];  // step7 == 4*step

    float *response0 = layer0->response;
    float *response1 = layer1->response;
    float *response2 = layer2->response;
    float *response3 = layer3->response;
    float *response4 = layer4->response;
    float *response5 = layer5->response;
    float *response6 = layer6->response;
    float *response7 = layer7->response;

    bool *laplacian0 = layer0->laplacian;
    bool *laplacian1 = layer1->laplacian;
    bool *laplacian2 = layer2->laplacian;
    bool *laplacian3 = layer3->laplacian;
    bool *laplacian4 = layer4->laplacian;
    bool *laplacian5 = layer5->laplacian;
    bool *laplacian6 = layer6->laplacian;
    bool *laplacian7 = layer7->laplacian;

    int filter_size0 = layer0->filter_size;
    int filter_size1 = layer1->filter_size;
    int filter_size2 = layer2->filter_size;
    int filter_size3 = layer3->filter_size;
    int filter_size4 = layer4->filter_size;
    int filter_size5 = layer5->filter_size;
    int filter_size6 = layer6->filter_size;
    int filter_size7 = layer7->filter_size;

    int height = layer0->height;
    int width = layer0->width;

    int lobe0 = filter_size0/3;
    int lobe1 = filter_size1/3;
    int lobe2 = filter_size2/3;
    int lobe3 = filter_size3/3;
    int lobe4 = filter_size4/3;
    int lobe5 = filter_size5/3;
    int lobe6 = filter_size6/3;
    int lobe7 = filter_size7/3;

    int border0 = (filter_size0-1)/2;
    int border1 = (filter_size1-1)/2;
    int border2 = (filter_size2-1)/2;
    int border3 = (filter_size3-1)/2;
    int border4 = (filter_size4-1)/2;
    int border5 = (filter_size5-1)/2;
    int border6 = (filter_size6-1)/2;
    int border7 = (filter_size7-1)/2;

    float inv_area0 = 1.f/(filter_size0*filter_size0);
    float inv_area1 = 1.f/(filter_size1*filter_size1);
    float inv_area2 = 1.f/(filter_size2*filter_size2);
    float inv_area3 = 1.f/(filter_size3*filter_size3);
    float inv_area4 = 1.f/(filter_size4*filter_size4);
    float inv_area5 = 1.f/(filter_size5*filter_size5);
    float inv_area6 = 1.f/(filter_size6*filter_size6);
    float inv_area7 = 1.f/(filter_size7*filter_size7);

    float inv_area_squared0 = (inv_area0*inv_area0);
    float inv_area_squared1 = (inv_area1*inv_area1);
    float inv_area_squared2 = (inv_area2*inv_area2);
    float inv_area_squared3 = (inv_area3*inv_area3);
    float inv_area_squared4 = (inv_area4*inv_area4);
    float inv_area_squared5 = (inv_area5*inv_area5);
    float inv_area_squared6 = (inv_area6*inv_area6);
    float inv_area_squared7 = (inv_area7*inv_area7);


    for (int i = 0, ind = 0, ind2 = 0, ind4 = 0; i < height; ++i) {
        for (int j = 0; j < width; ++j, ind++) {
            // Image coordinates
            x = i * step;
            y = j * step;

            // layer0
            // Calculate Dxx, Dyy, Dxy with Box Filter
            Dxx0 = box_integral(iimage, x - lobe0 + 1, y - border0, 2 * lobe0 - 1, filter_size0) -
                   3 * box_integral(iimage, x - lobe0 + 1, y - lobe0 / 2, 2 * lobe0 - 1, lobe0);
            Dyy0 = box_integral(iimage, x - border0, y - lobe0 + 1, filter_size0, 2 * lobe0 - 1) -
                   3 * box_integral(iimage, x - lobe0 / 2, y - lobe0 + 1, lobe0, 2 * lobe0 - 1);
            Dxy0 = box_integral(iimage, x - lobe0, y + 1, lobe0, lobe0) +
                   box_integral(iimage, x + 1, y - lobe0, lobe0, lobe0) -
                   box_integral(iimage, x - lobe0, y - lobe0, lobe0, lobe0) -
                   box_integral(iimage, x + 1, y + 1, lobe0, lobe0);

            // Normalize Responses with inverse area
            // Dxx0 *= inv_area0;
            // Dyy0 *= inv_area0;
            // Dxy0 *= inv_area0;

            // Calculate Determinant
            response0[ind] = inv_area_squared0*(Dxx0 * Dyy0 - 0.81f * Dxy0 * Dxy0);

            // Calculate Laplacian
            laplacian0[ind] = (Dxx0 + Dyy0 >= 0 ? true : false);


            // layer1
            // Calculate Dxx, Dyy, Dxy with Box Filter
            Dxx1 = box_integral(iimage, x - lobe1 + 1, y - border1, 2 * lobe1 - 1, filter_size1) -
                   3 * box_integral(iimage, x - lobe1 + 1, y - lobe1 / 2, 2 * lobe1 - 1, lobe1);
            Dyy1 = box_integral(iimage, x - border1, y - lobe1 + 1, filter_size1, 2 * lobe1 - 1) -
                   3 * box_integral(iimage, x - lobe1 / 2, y - lobe1 + 1, lobe1, 2 * lobe1 - 1);
            Dxy1 = box_integral(iimage, x - lobe1, y + 1, lobe1, lobe1) +
                   box_integral(iimage, x + 1, y - lobe1, lobe1, lobe1) -
                   box_integral(iimage, x - lobe1, y - lobe1, lobe1, lobe1) -
                   box_integral(iimage, x + 1, y + 1, lobe1, lobe1);

            // Normalize Responses with inverse area
            // Dxx1 *= inv_area1;
            // Dyy1 *= inv_area1;
            // Dxy1 *= inv_area1;

            // Calculate Determinant
            response1[ind] = inv_area_squared1*(Dxx1 * Dyy1 - 0.81f * Dxy1 * Dxy1);

            // Calculate Laplacian
            laplacian1[ind] = (Dxx1 + Dyy1 >= 0 ? true : false);


            // layer2
            // Calculate Dxx, Dyy, Dxy with Box Filter
            Dxx2 = box_integral(iimage, x - lobe2 + 1, y - border2, 2 * lobe2 - 1, filter_size2) -
                   3 * box_integral(iimage, x - lobe2 + 1, y - lobe2 / 2, 2 * lobe2 - 1, lobe2);
            Dyy2 = box_integral(iimage, x - border2, y - lobe2 + 1, filter_size2, 2 * lobe2 - 1) -
                   3 * box_integral(iimage, x - lobe2 / 2, y - lobe2 + 1, lobe2, 2 * lobe2 - 1);
            Dxy2 = box_integral(iimage, x - lobe2, y + 1, lobe2, lobe2) +
                   box_integral(iimage, x + 1, y - lobe2, lobe2, lobe2) -
                   box_integral(iimage, x - lobe2, y - lobe2, lobe2, lobe2) -
                   box_integral(iimage, x + 1, y + 1, lobe2, lobe2);

            // Normalize Responses with inverse area
            // Dxx2 *= inv_area2;
            // Dyy2 *= inv_area2;
            // Dxy2 *= inv_area2;

            // Calculate Determinant
            response2[ind] = inv_area_squared2*(Dxx2 * Dyy2 - 0.81f * Dxy2 * Dxy2);

            // Calculate Laplacian
            laplacian2[ind] = (Dxx2 + Dyy2 >= 0 ? true : false);


            // layer3
            // Calculate Dxx, Dyy, Dxy with Box Filter
            Dxx3 = box_integral(iimage, x - lobe3 + 1, y - border3, 2*lobe3 - 1, filter_size3)
                    - 3 * box_integral(iimage, x - lobe3 + 1, y - lobe3 / 2, 2*lobe3 - 1, lobe3);
            Dyy3 = box_integral(iimage, x - border3, y - lobe3 + 1, filter_size3, 2*lobe3 - 1)
                    - 3 * box_integral(iimage, x - lobe3 / 2, y - lobe3 + 1, lobe3, 2*lobe3 - 1);
            Dxy3 = box_integral(iimage, x - lobe3, y + 1, lobe3, lobe3)
                    + box_integral(iimage, x + 1, y - lobe3, lobe3, lobe3)
                    - box_integral(iimage, x - lobe3, y - lobe3, lobe3, lobe3)
                    - box_integral(iimage, x + 1, y + 1, lobe3, lobe3);

            // Normalize Responses with inverse area
            // Dxx3 *= inv_area3;
            // Dyy3 *= inv_area3;
            // Dxy3 *= inv_area3;

            // Calculate Determinant
            response3[ind] = inv_area_squared3*(Dxx3 * Dyy3 - 0.81f * Dxy3 * Dxy3);

            // Calculate Laplacian
            laplacian3[ind] = (Dxx3 + Dyy3 >= 0 ? true : false);


            // 2*step
            if (i % 2 == 0 && j % 2 == 0) {
                // layer4
                // Calculate Dxx, Dyy, Dxy with Box Filter
                Dxx4 = box_integral(iimage, x - lobe4 + 1, y - border4, 2*lobe4 - 1, filter_size4)
                        - 3 * box_integral(iimage, x - lobe4 + 1, y - lobe4 / 2, 2*lobe4 - 1, lobe4);
                Dyy4 = box_integral(iimage, x - border4, y - lobe4 + 1, filter_size4, 2*lobe4 - 1)
                        - 3 * box_integral(iimage, x - lobe4 / 2, y - lobe4 + 1, lobe4, 2*lobe4 - 1);
                Dxy4 = box_integral(iimage, x - lobe4, y + 1, lobe4, lobe4)
                        + box_integral(iimage, x + 1, y - lobe4, lobe4, lobe4)
                        - box_integral(iimage, x - lobe4, y - lobe4, lobe4, lobe4)
                        - box_integral(iimage, x + 1, y + 1, lobe4, lobe4);

                // Normalize Responses with inverse area
                // Dxx4 *= inv_area4;
                // Dyy4 *= inv_area4;
                // Dxy4 *= inv_area4;

                // Calculate Determinant
                response4[ind2] = inv_area_squared4*(Dxx4 * Dyy4 - 0.81f * Dxy4 * Dxy4);

                // Calculate Laplacian
                laplacian4[ind2] = (Dxx4 + Dyy4 >= 0 ? true : false);


                // layer5
                // Calculate Dxx, Dyy, Dxy with Box Filter
                Dxx5 = box_integral(iimage, x - lobe5 + 1, y - border5, 2*lobe5 - 1, filter_size5)
                        - 3 * box_integral(iimage, x - lobe5 + 1, y - lobe5 / 2, 2*lobe5 - 1, lobe5);
                Dyy5 = box_integral(iimage, x - border5, y - lobe5 + 1, filter_size5, 2*lobe5 - 1)
                        - 3 * box_integral(iimage, x - lobe5 / 2, y - lobe5 + 1, lobe5, 2*lobe5 - 1);
                Dxy5 = box_integral(iimage, x - lobe5, y + 1, lobe5, lobe5)
                        + box_integral(iimage, x + 1, y - lobe5, lobe5, lobe5)
                        - box_integral(iimage, x - lobe5, y - lobe5, lobe5, lobe5)
                        - box_integral(iimage, x + 1, y + 1, lobe5, lobe5);

                // Normalize Responses with inverse area
                // Dxx5 *= inv_area5;
                // Dyy5 *= inv_area5;
                // Dxy5 *= inv_area5;

                // Calculate Determinant
                response5[ind2] = inv_area_squared5*(Dxx5 * Dyy5 - 0.81f * Dxy5 * Dxy5);

                // Calculate Laplacian
                laplacian5[ind2] = (Dxx5 + Dyy5 >= 0 ? true : false);


                ind2++;

                // 4*step
                if (i % 4 == 0 && j % 4 == 0) {
                    // layer6
                    // Calculate Dxx, Dyy, Dxy with Box Filter
                    Dxx6 = box_integral(iimage, x - lobe6 + 1, y - border6, 2*lobe6 - 1, filter_size6)
                            - 3 * box_integral(iimage, x - lobe6 + 1, y - lobe6 / 2, 2*lobe6 - 1, lobe6);
                    Dyy6 = box_integral(iimage, x - border6, y - lobe6 + 1, filter_size6, 2*lobe6 - 1)
                            - 3 * box_integral(iimage, x - lobe6 / 2, y - lobe6 + 1, lobe6, 2*lobe6 - 1);
                    Dxy6 = box_integral(iimage, x - lobe6, y + 1, lobe6, lobe6)
                            + box_integral(iimage, x + 1, y - lobe6, lobe6, lobe6)
                            - box_integral(iimage, x - lobe6, y - lobe6, lobe6, lobe6)
                            - box_integral(iimage, x + 1, y + 1, lobe6, lobe6);

                    // Normalize Responses with inverse area
                    // Dxx6 *= inv_area6;
                    // Dyy6 *= inv_area6;
                    // Dxy6 *= inv_area6;

                    // Calculate Determinant
                    response6[ind4] = inv_area_squared6*(Dxx6 * Dyy6 - 0.81f * Dxy6 * Dxy6);

                    // Calculate Laplacian
                    laplacian6[ind4] = (Dxx6 + Dyy6 >= 0 ? true : false);


                    // layer7
                    // Calculate Dxx, Dyy, Dxy with Box Filter
                    Dxx7 = box_integral(iimage, x - lobe7 + 1, y - border7, 2*lobe7 - 1, filter_size7)
                            - 3 * box_integral(iimage, x - lobe7 + 1, y - lobe7 / 2, 2*lobe7 - 1, lobe7);
                    Dyy7 = box_integral(iimage, x - border7, y - lobe7 + 1, filter_size7, 2*lobe7 - 1)
                            - 3 * box_integral(iimage, x - lobe7 / 2, y - lobe7 + 1, lobe7, 2*lobe7 - 1);
                    Dxy7 = box_integral(iimage, x - lobe7, y + 1, lobe7, lobe7)
                            + box_integral(iimage, x + 1, y - lobe7, lobe7, lobe7)
                            - box_integral(iimage, x - lobe7, y - lobe7, lobe7, lobe7)
                            - box_integral(iimage, x + 1, y + 1, lobe7, lobe7);

                    // Normalize Responses with inverse area
                    // Dxx7 *= inv_area7;
                    // Dyy7 *= inv_area7;
                    // Dxy7 *= inv_area7;

                    // Calculate Determinant
                    response7[ind4] = inv_area_squared7*(Dxx7 * Dyy7 - 0.81f * Dxy7 * Dxy7);

                    // Calculate Laplacian
                    laplacian7[ind4] = (Dxx7 + Dyy7 >= 0 ? true : false);


                    ind4++;
                }
            }

            // template for search and replace J to layer number
            // // layerJ
            // // Calculate Dxx, Dyy, Dxy with Box Filter
            // DxxJ = box_integral(iimage, x - lobeJ + 1, y - borderJ, 2*lobeJ - 1, filter_sizeJ)
            //         - 3 * box_integral(iimage, x - lobeJ + 1, y - lobeJ / 2, 2*lobeJ - 1, lobeJ);
            // DyyJ = box_integral(iimage, x - borderJ, y - lobeJ + 1, filter_sizeJ, 2*lobeJ - 1)
            //         - 3 * box_integral(iimage, x - lobeJ / 2, y - lobeJ + 1, lobeJ, 2*lobeJ - 1);
            // DxyJ = box_integral(iimage, x - lobeJ, y + 1, lobeJ, lobeJ)
            //         + box_integral(iimage, x + 1, y - lobeJ, lobeJ, lobeJ)
            //         - box_integral(iimage, x - lobeJ, y - lobeJ, lobeJ, lobeJ)
            //         - box_integral(iimage, x + 1, y + 1, lobeJ, lobeJ);

            // // Normalize Responses with inverse area
            // DxxJ *= inv_areaJ;
            // DyyJ *= inv_areaJ;
            // DxyJ *= inv_areaJ;

            // // Calculate Determinant
            // responseJ[ind] = DxxJ * DyyJ - 0.81f * DxyJ * DxyJ;

            // // Calculate Laplacian
            // laplacianJ[ind] = (DxxJ + DyyJ >= 0 ? true : false);
        }
    }

}